

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eci.cc
# Opt level: O2

CoordGeodetic * __thiscall libsgp4::Eci::ToGeodetic(CoordGeodetic *__return_storage_ptr__,Eci *this)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = Util::AcTan((this->m_position).y,(this->m_position).x);
  dVar4 = DateTime::ToGreenwichSiderealTime(&this->m_dt);
  dVar5 = (this->m_position).x;
  dVar8 = (this->m_position).y;
  dVar8 = SQRT(dVar5 * dVar5 + dVar8 * dVar8);
  dVar5 = Util::AcTan((this->m_position).z,dVar8);
  uVar1 = 0;
  do {
    dVar6 = sin(dVar5);
    dVar7 = dVar6 * -0.006694317778266723 * dVar6 + 1.0;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar6 = Util::AcTan((1.0 / dVar7) * 6378.135 * 0.006694317778266723 * dVar6 +
                        (this->m_position).z,dVar8);
  } while ((1e-10 <= ABS(dVar6 - dVar5)) &&
          (bVar2 = uVar1 < 9, dVar5 = dVar6, uVar1 = uVar1 + 1, bVar2));
  dVar5 = (dVar3 - dVar4) + 3.141592653589793;
  dVar3 = floor(dVar5 / 6.283185307179586);
  dVar4 = cos(dVar6);
  __return_storage_ptr__->latitude = dVar6;
  __return_storage_ptr__->longitude = dVar3 * -6.283185307179586 + dVar5 + -3.141592653589793;
  __return_storage_ptr__->altitude = (1.0 / dVar7) * -6378.135 + dVar8 / dVar4;
  return __return_storage_ptr__;
}

Assistant:

CoordGeodetic Eci::ToGeodetic() const
{
    const double theta = Util::AcTan(m_position.y, m_position.x);

    const double lon = Util::WrapNegPosPI(theta
            - m_dt.ToGreenwichSiderealTime());

    const double r = sqrt((m_position.x * m_position.x)
            + (m_position.y * m_position.y));

    static const double e2 = kF * (2.0 - kF);

    double lat = Util::AcTan(m_position.z, r);
    double phi = 0.0;
    double c = 0.0;
    int cnt = 0;

    do
    {
        phi = lat;
        const double sinphi = sin(phi);
        c = 1.0 / sqrt(1.0 - e2 * sinphi * sinphi);
        lat = Util::AcTan(m_position.z + kXKMPER * c * e2 * sinphi, r);
        cnt++;
    }
    while (fabs(lat - phi) >= 1e-10 && cnt < 10);

    const double alt = r / cos(lat) - kXKMPER * c;

    return CoordGeodetic(lat, lon, alt, true);
}